

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

BIGNUM * BN_new(void)

{
  BIGNUM *ret;
  size_t in_stack_fffffffffffffff0;
  BIGNUM *local_8;
  
  local_8 = (BIGNUM *)CRYPTO_zalloc(in_stack_fffffffffffffff0);
  if (local_8 == (BIGNUM *)0x0) {
    local_8 = (BIGNUM *)0x0;
  }
  else {
    local_8->flags = 1;
  }
  return local_8;
}

Assistant:

BIGNUM *BN_new(void)
{
    BIGNUM *ret;

    if ((ret = CRYPTO_zalloc(sizeof(*ret))) == NULL) {
        //BNerr(BN_F_BN_NEW, ERR_R_MALLOC_FAILURE);
        return (NULL);
    }
    ret->flags = BN_FLG_MALLOCED;
    bn_check_top(ret);
    return (ret);
}